

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiLabelFileParser.cpp
# Opt level: O2

void __thiscall
MultiLabelFileParser::writeLabelList(MultiLabelFileParser *this,string *labelListFilename)

{
  int c;
  ulong uVar1;
  long lVar2;
  int l;
  ulong uVar3;
  ofstream labelListFp;
  
  std::ofstream::ofstream((string *)&labelListFp);
  std::ofstream::open((string *)&labelListFp,(_Ios_Openmode)labelListFilename);
  for (uVar3 = 0; uVar3 < this->_L; uVar3 = uVar3 + 1) {
    lVar2 = 0;
    for (uVar1 = 0;
        uVar1 < (this->_C).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar3]; uVar1 = uVar1 + 1) {
      std::operator<<((ostream *)&labelListFp,
                      (string *)
                      (*(long *)&(this->_labelList).
                                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar3].
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data + lVar2));
      if (uVar1 != (this->_C).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar3] - 1) {
        std::operator<<((ostream *)&labelListFp,',');
      }
      lVar2 = lVar2 + 0x20;
    }
    if (uVar3 != this->_L - 1) {
      std::endl<char,std::char_traits<char>>((ostream *)&labelListFp);
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&labelListFp);
  return;
}

Assistant:

void MultiLabelFileParser::writeLabelList(string labelListFilename)const{//{{{
    ofstream labelListFp;
    labelListFp.open(labelListFilename,ios::out);
    for(int l=0; l<_L; l++){
        for(int c=0; c<_C[l]; c++){
            labelListFp<<_labelList[l][c];
            if(c != (_C[l]-1))labelListFp<<',';
        }
        if(l != (_L-1))labelListFp<<endl;
    }
    labelListFp.close();
}